

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWrd.h
# Opt level: O0

Vec_Wrd_t * Vec_WrdDup(Vec_Wrd_t *pVec)

{
  Vec_Wrd_t *pVVar1;
  word *local_20;
  Vec_Wrd_t *p;
  Vec_Wrd_t *pVec_local;
  
  pVVar1 = (Vec_Wrd_t *)malloc(0x10);
  pVVar1->nSize = pVec->nSize;
  pVVar1->nCap = pVec->nSize;
  if (pVVar1->nCap == 0) {
    local_20 = (word *)0x0;
  }
  else {
    local_20 = (word *)malloc((long)pVVar1->nCap << 3);
  }
  pVVar1->pArray = local_20;
  memcpy(pVVar1->pArray,pVec->pArray,(long)pVec->nSize << 3);
  return pVVar1;
}

Assistant:

static inline Vec_Wrd_t * Vec_WrdDup( Vec_Wrd_t * pVec )
{
    Vec_Wrd_t * p;
    p = ABC_ALLOC( Vec_Wrd_t, 1 );
    p->nSize  = pVec->nSize;
    p->nCap   = pVec->nSize;
    p->pArray = p->nCap? ABC_ALLOC( word, p->nCap ) : NULL;
    memcpy( p->pArray, pVec->pArray, sizeof(word) * (size_t)pVec->nSize );
    return p;
}